

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinput.cpp
# Opt level: O0

void __thiscall
my_input_handlers::Input_Event_Notify
          (my_input_handlers *this,Am_Drawonable *draw,Am_Input_Event *ev)

{
  Am_Input_Event *pAVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Input_Char local_f0;
  Am_Input_Char local_ec;
  Am_Input_Char local_e8;
  Am_Input_Char local_e4;
  Am_Input_Char local_e0;
  Am_Input_Char local_dc;
  Am_Input_Char local_d8;
  Am_Input_Char local_d4;
  Am_Input_Char local_d0;
  Am_Input_Char local_cc;
  Am_Input_Char local_c8;
  byte local_c1;
  Am_Input_Char local_c0;
  uchar c;
  Am_Value v2;
  Am_Input_Char local_9c;
  Am_Value local_98 [4];
  Am_Input_Char ic2;
  Am_Value v;
  char local_88 [8];
  char s [100];
  Am_Input_Event *ev_local;
  Am_Drawonable *draw_local;
  my_input_handlers *this_local;
  
  unique0x100007a2 = ev;
  Am_Input_Char::As_Short_String((char *)ev);
  poVar3 = std::operator<<((ostream *)&std::cout,"My Input Event \"");
  poVar3 = (ostream *)operator<<(poVar3,&stack0xffffffffffffffe0->input_char);
  poVar3 = std::operator<<(poVar3,"\" short=\"");
  poVar3 = std::operator<<(poVar3,local_88);
  std::operator<<(poVar3,"\" on ");
  if (draw == d) {
    std::operator<<((ostream *)&std::cout,"d\n");
  }
  else if (draw == d2) {
    std::operator<<((ostream *)&std::cout,"d2\n");
  }
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)local_98);
  Am_Input_Char::Am_Input_Char(&local_9c,local_98);
  Am_Input_Char::operator_cast_to_Am_Value(&local_c0);
  local_c1 = Am_Input_Char::As_Char();
  poVar3 = std::operator<<((ostream *)&std::cout,"   (unsigned char)=`");
  poVar3 = std::operator<<(poVar3,local_c1);
  poVar3 = std::operator<<(poVar3,"\'=(char)=");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(uint)local_c1);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,(ulong)local_c1);
  poVar3 = std::operator<<(poVar3," (long) ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,_v);
  poVar3 = std::operator<<(poVar3," back to Input_Char = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,_v2);
  poVar3 = std::operator<<(poVar3," new long = ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,_v2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  if ((test_ic_set & 1U) != 0) {
    local_c8 = test_ic;
    bVar2 = Am_Input_Char::operator==(&stack0xffffffffffffffe0->input_char,test_ic);
    if (bVar2) {
      std::operator<<((ostream *)&std::cout,"   *=* ");
    }
    else {
      std::operator<<((ostream *)&std::cout,"   *NOT* = ");
    }
    poVar3 = std::operator<<((ostream *)&std::cout," test_ic (");
    poVar3 = (ostream *)operator<<(poVar3,&test_ic);
    poVar3 = std::operator<<(poVar3,")\n");
    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  }
  pAVar1 = stack0xffffffffffffffe0;
  Am_Input_Char::Am_Input_Char(&local_cc,"CONTROL_M",true);
  bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_cc);
  pAVar1 = stack0xffffffffffffffe0;
  if (bVar2) {
    std::operator<<((ostream *)&std::cout,"==Turning on want move\n");
    (**(code **)(*(long *)draw + 400))(draw,1);
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_d0,"CONTROL_m",true);
    bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_d0);
    pAVar1 = stack0xffffffffffffffe0;
    if (bVar2) {
      std::operator<<((ostream *)&std::cout,"==Turning off want move\n");
      (**(code **)(*(long *)draw + 400))(draw,0);
    }
    else {
      Am_Input_Char::Am_Input_Char(&local_d4,"CONTROL_x",true);
      bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_d4);
      pAVar1 = stack0xffffffffffffffe0;
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"==Turning on want move\n");
        (**(code **)(*(long *)draw + 400))(draw,1);
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_d8,"CONTROL_e",true);
        bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_d8);
        pAVar1 = stack0xffffffffffffffe0;
        if (bVar2) {
          std::operator<<((ostream *)&std::cout,"==Turning off enter leave\n");
          (**(code **)(*(long *)draw + 0x188))(draw,0);
        }
        else {
          Am_Input_Char::Am_Input_Char(&local_dc,"CONTROL_E",true);
          bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_dc);
          pAVar1 = stack0xffffffffffffffe0;
          if (bVar2) {
            std::operator<<((ostream *)&std::cout,"==Turning on enter leave\n");
            (**(code **)(*(long *)draw + 0x188))(draw,1);
          }
          else {
            Am_Input_Char::Am_Input_Char(&local_e0,"CONTROL_w",true);
            bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_e0);
            pAVar1 = stack0xffffffffffffffe0;
            if (bVar2) {
              std::operator<<((ostream *)&std::cout,"==Turning off multiple windows\n");
              (**(code **)(*(long *)draw + 0x198))(draw,0);
            }
            else {
              Am_Input_Char::Am_Input_Char(&local_e4,"CONTROL_W",true);
              bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_e4);
              pAVar1 = stack0xffffffffffffffe0;
              if (bVar2) {
                std::operator<<((ostream *)&std::cout,"==Turning on multiple windows\n");
                (**(code **)(*(long *)draw + 0x198))(draw,1);
              }
              else {
                Am_Input_Char::Am_Input_Char(&local_e8,"CONTROL_t",true);
                bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_e8);
                pAVar1 = stack0xffffffffffffffe0;
                if (bVar2) {
                  std::operator<<((ostream *)&std::cout,"type new input string to test against: ");
                  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,local_88
                                 );
                  Am_Input_Char::Am_Input_Char(&local_ec,local_88,true);
                  Am_Input_Char::operator=(&test_ic,&local_ec);
                  test_ic_set = true;
                }
                else {
                  Am_Input_Char::Am_Input_Char(&local_f0,"CONTROL_q",true);
                  bVar2 = Am_Input_Char::operator==(&pAVar1->input_char,local_f0);
                  if (bVar2) {
                    poVar3 = std::operator<<((ostream *)&std::cout,"Quitting\n");
                    std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
                    exit(0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Am_Value::~Am_Value((Am_Value *)&local_c0);
  Am_Value::~Am_Value(local_98);
  return;
}

Assistant:

void Input_Event_Notify(Am_Drawonable *draw, Am_Input_Event *ev) override
  {
    char s[100];

    ev->input_char.As_Short_String(s);
    cout << "My Input Event \"" << ev->input_char << "\" short=\"" << s
         << "\" on ";
    if (draw == d)
      cout << "d\n";
    else if (draw == d2)
      cout << "d2\n";

    Am_Value v = Am_Value(ev->input_char);
    Am_Input_Char ic2 = v;
    Am_Value v2 = Am_Value(ic2);
    unsigned char c = ev->input_char.As_Char();

    cout << "   (unsigned char)=`" << c << "'=(char)=" << (unsigned int)c
         << (long)c << " (long) " << v.value.long_value
         << " back to Input_Char = " << v2.value.long_value
         << " new long = " << v2.value.long_value << endl;

    if (test_ic_set) {
      if (ev->input_char == test_ic)
        cout << "   *=* ";
      else
        cout << "   *NOT* = ";
      cout << " test_ic (" << test_ic << ")\n" << flush;
    }
    if (ev->input_char == "CONTROL_M") {
      cout << "==Turning on want move\n";
      draw->Set_Want_Move(true);
    } else if (ev->input_char == "CONTROL_m") {
      cout << "==Turning off want move\n";
      draw->Set_Want_Move(false);
    } else if (ev->input_char == "CONTROL_x") {
      cout << "==Turning on want move\n";
      draw->Set_Want_Move(true);
    } else if (ev->input_char == "CONTROL_e") {
      cout << "==Turning off enter leave\n";
      draw->Set_Enter_Leave(false);
    } else if (ev->input_char == "CONTROL_E") {
      cout << "==Turning on enter leave\n";
      draw->Set_Enter_Leave(true);
    } else if (ev->input_char == "CONTROL_w") {
      cout << "==Turning off multiple windows\n";
      draw->Set_Multi_Window(false);
    } else if (ev->input_char == "CONTROL_W") {
      cout << "==Turning on multiple windows\n";
      draw->Set_Multi_Window(true);
    } else if (ev->input_char == "CONTROL_t") {
      cout << "type new input string to test against: ";
      cin >> s;
      test_ic = Am_Input_Char(s);
      test_ic_set = true;
    } else if (ev->input_char == "CONTROL_q") {
      cout << "Quitting\n" << flush;
      exit(0);
    }
  }